

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O2

int big_file_mpi_create_block
              (BigFile *bf,BigBlock *block,char *blockname,char *dtype,int nmemb,int Nfile,
              size_t size,MPI_Comm comm)

{
  long lVar1;
  char *dtype_00;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long alStack_60 [3];
  long lStack_48;
  char *local_40;
  int local_34;
  
  local_34 = nmemb;
  local_40 = dtype;
  lVar1 = -((ulong)(uint)Nfile * 8 + 0xf & 0xfffffffffffffff0);
  uVar4 = 0;
  if (0 < Nfile) {
    uVar4 = (ulong)(uint)Nfile;
  }
  uVar5 = 0;
  for (uVar3 = 0; iVar2 = local_34, dtype_00 = local_40, uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(ulong *)((long)&lStack_48 + lVar1 + uVar3 * 8) =
         (uVar5 + size) / (ulong)(long)Nfile - uVar5 / (ulong)(long)Nfile;
    uVar5 = uVar5 + size;
  }
  *(MPI_Comm *)((long)alStack_60 + lVar1 + 0x10) = comm;
  *(long *)((long)alStack_60 + lVar1 + 8) = (long)&lStack_48 + lVar1;
  *(undefined8 *)((long)alStack_60 + lVar1) = 0x103f97;
  iVar2 = _big_file_mpi_create_block
                    (bf,block,blockname,dtype_00,iVar2,Nfile,
                     *(size_t **)((long)alStack_60 + lVar1 + 8),
                     *(MPI_Comm *)((long)alStack_60 + lVar1 + 0x10));
  return iVar2;
}

Assistant:

int
_big_file_mpi_create_block(BigFile * bf,
        BigBlock * block,
        const char * blockname,
        const char * dtype,
        int nmemb,
        int Nfile,
        const size_t fsize[],
        MPI_Comm comm)
{
    if(comm == MPI_COMM_NULL) return 0;
    int rank;
    MPI_Comm_rank(comm, &rank);

    int rt = 0;
    if (rank == 0) {
        rt = _big_file_mksubdir_r(bf->basename, blockname);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    char * basename = alloca(strlen(bf->basename) + strlen(blockname) + 128);
    sprintf(basename, "%s/%s/", bf->basename, blockname);
    return _big_block_mpi_create(block, basename, dtype, nmemb, Nfile, fsize, comm);
}